

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void>::visit
          (ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void> *this,Arg *arg)

{
  uint uVar1;
  ulong uVar2;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  int iVar3;
  
  iVar3 = (int)arg;
  switch(*(undefined4 *)(CONCAT71(in_register_00000011,in_DL) + 0x10)) {
  case 2:
  case 7:
    uVar1 = *(uint *)CONCAT71(in_register_00000011,in_DL);
    uVar2 = (ulong)(int)uVar1;
    if ((iVar3 == 0x69) || (iVar3 == 100)) {
      *(undefined4 *)(this + 0x10) = 4;
    }
    else {
      *(undefined4 *)(this + 0x10) = 5;
      uVar2 = (ulong)uVar1;
    }
    goto LAB_004928a8;
  case 3:
    uVar2 = (ulong)*(uint *)CONCAT71(in_register_00000011,in_DL);
    break;
  case 4:
  case 5:
    uVar2 = *(ulong *)CONCAT71(in_register_00000011,in_DL);
    break;
  case 6:
    if (iVar3 == 0x73) {
      return;
    }
    uVar2 = (ulong)(*(int *)CONCAT71(in_register_00000011,in_DL) != 0);
    break;
  default:
    goto switchD_00492863_default;
  }
  *(uint *)(this + 0x10) = (iVar3 == 100 || iVar3 == 0x69) ^ 5;
LAB_004928a8:
  *(ulong *)this = uVar2;
switchD_00492863_default:
  return;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    case Arg::NONE:
    case Arg::NAMED_ARG:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
    return Result();
  }